

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

attr_list attr_add_list(attr_list list1,attr_list list2)

{
  attr_list *pp_Var1;
  attr_list p_Var2;
  
  init_global_atom_server((atom_server *)list1);
  if (list1->list_of_lists != 0) {
    pp_Var1 = (attr_list *)
              realloc((list1->l).lists.lists,(long)(list1->l).lists.sublist_count * 8 + 8);
    (list1->l).lists.lists = pp_Var1;
    pp_Var1[(list1->l).lists.sublist_count] = list2;
    list2->ref_count = list2->ref_count + 1;
    (list1->l).lists.sublist_count = (list1->l).lists.sublist_count + 1;
    return list1;
  }
  p_Var2 = attr_join_lists(list1,list2);
  return p_Var2;
}

Assistant:

extern attr_list
attr_add_list(attr_list list1, attr_list list2)
{
    init_global_atom_server(&global_as);
    if (list1->list_of_lists == 0) {
        return attr_join_lists(list1, list2);
    }
    list1->l.lists.lists =
           (attr_list *)realloc(list1->l.lists.lists, sizeof(attr_list) *
                                (list1->l.lists.sublist_count+1));
    list1->l.lists.lists[list1->l.lists.sublist_count] = list2;
    list2->ref_count++;
    list1->l.lists.sublist_count += 1;
    return list1;   
}